

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestGroupStats::TestGroupStats
          (TestGroupStats *this,GroupInfo *_groupInfo,Totals *_totals,bool _aborting)

{
  byte in_CL;
  undefined8 *in_RDI;
  Totals *in_stack_ffffffffffffffb8;
  Totals *this_00;
  
  *in_RDI = &PTR__TestGroupStats_00a1ba60;
  this_00 = (Totals *)(in_RDI + 1);
  GroupInfo::GroupInfo((GroupInfo *)this_00,(GroupInfo *)in_stack_ffffffffffffffb8);
  Totals::Totals(this_00,in_stack_ffffffffffffffb8);
  *(byte *)(in_RDI + 0x15) = in_CL & 1;
  return;
}

Assistant:

TestGroupStats::TestGroupStats( GroupInfo const& _groupInfo,
                                    Totals const& _totals,
                                    bool _aborting )
    :   groupInfo( _groupInfo ),
        totals( _totals ),
        aborting( _aborting )
    {}